

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O1

void __thiscall Analyser::analyse_scan_statement(Analyser *this)

{
  int iVar1;
  bool bVar2;
  long *plVar3;
  string *psVar4;
  size_type *psVar5;
  optional<Token> next;
  string var;
  _Arg __arg;
  _Storage<Token,_false> local_140;
  char local_120;
  undefined1 local_118 [32];
  bool local_f8;
  string local_f0;
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  _Arg local_30;
  
  nextToken((optional<Token> *)local_118,this);
  if ((local_f8 != true) || (local_118._0_4_ != LEFT_BRACKET)) {
    psVar4 = (string *)__cxa_allocate_exception(0x28);
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Missing \'(\'","");
    iVar1 = this->_currentLine;
    *(string **)psVar4 = psVar4 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar4,local_50,local_50 + local_48);
    *(long *)(psVar4 + 0x20) = (long)iVar1;
    __cxa_throw(psVar4,&Error::typeinfo,Error::~Error);
  }
  nextToken((optional<Token> *)&local_140._M_value,this);
  std::_Optional_payload_base<Token>::_M_move_assign
            ((_Optional_payload_base<Token> *)local_118,
             (_Optional_payload_base<Token> *)&local_140._M_value);
  if (local_120 == '\x01') {
    std::_Optional_payload_base<Token>::_M_destroy
              ((_Optional_payload_base<Token> *)&local_140._M_value);
  }
  if ((local_f8 != true) || (local_118._0_4_ != IDENTIFIER)) {
    psVar4 = (string *)__cxa_allocate_exception(0x28);
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Missing identifier","");
    iVar1 = this->_currentLine;
    *(string **)psVar4 = psVar4 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar4,local_70,local_70 + local_68);
    *(long *)(psVar4 + 0x20) = (long)iVar1;
    __cxa_throw(psVar4,&Error::typeinfo,Error::~Error);
  }
  local_140._M_value._value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  if ((_func_void__Op_any_ptr__Arg_ptr *)local_118._8_8_ == (_func_void__Op_any_ptr__Arg_ptr *)0x0)
  {
    local_140._0_8_ = (code *)0x0;
  }
  else {
    local_30._M_obj = &local_140;
    (*(code *)local_118._8_8_)(_Op_clone,(any *)(local_118 + 8),&local_30);
  }
  plVar3 = (long *)std::__any_caster<std::__cxx11::string>((any *)&local_140._M_value);
  if (plVar3 == (long *)0x0) {
    std::__throw_bad_any_cast();
  }
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_f0.field_2._M_allocated_capacity = *psVar5;
    local_f0.field_2._8_4_ = (undefined4)plVar3[3];
    local_f0.field_2._12_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar5;
    local_f0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_f0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((code *)local_140._0_8_ != (code *)0x0) {
    (*(code *)local_140._0_8_)(3,&local_140,0);
    local_140._0_8_ = (code *)0x0;
  }
  bVar2 = loadVariable(this,&local_f0);
  if (bVar2) {
    local_140._0_8_ = 0x15;
    local_140._M_value._value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    addInstruction(this,(Instruction *)&local_140._M_value);
    local_140._0_8_ = 0x17;
    local_140._M_value._value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    addInstruction(this,(Instruction *)&local_140._M_value);
    nextToken((optional<Token> *)&local_140._M_value,this);
    std::_Optional_payload_base<Token>::_M_move_assign
              ((_Optional_payload_base<Token> *)local_118,
               (_Optional_payload_base<Token> *)&local_140._M_value);
    if (local_120 == '\x01') {
      std::_Optional_payload_base<Token>::_M_destroy
                ((_Optional_payload_base<Token> *)&local_140._M_value);
    }
    if ((local_f8 != true) || (local_118._0_4_ != RIGHT_BRACKET)) {
      psVar4 = (string *)__cxa_allocate_exception(0x28);
      local_b0 = local_a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Missing \')\'","");
      iVar1 = this->_currentLine;
      *(string **)psVar4 = psVar4 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar4,local_b0,local_b0 + local_a8);
      *(long *)(psVar4 + 0x20) = (long)iVar1;
      __cxa_throw(psVar4,&Error::typeinfo,Error::~Error);
    }
    nextToken((optional<Token> *)&local_140._M_value,this);
    std::_Optional_payload_base<Token>::_M_move_assign
              ((_Optional_payload_base<Token> *)local_118,
               (_Optional_payload_base<Token> *)&local_140._M_value);
    if (local_120 == '\x01') {
      std::_Optional_payload_base<Token>::_M_destroy
                ((_Optional_payload_base<Token> *)&local_140._M_value);
    }
    if ((local_f8 == true) && (local_118._0_4_ == SEMICOLON)) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if (local_f8 == true) {
        std::_Optional_payload_base<Token>::_M_destroy((_Optional_payload_base<Token> *)local_118);
      }
      return;
    }
    psVar4 = (string *)__cxa_allocate_exception(0x28);
    local_d0 = local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Missing \';\'","");
    iVar1 = this->_currentLine;
    *(string **)psVar4 = psVar4 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar4,local_d0,local_d0 + local_c8);
    *(long *)(psVar4 + 0x20) = (long)iVar1;
    __cxa_throw(psVar4,&Error::typeinfo,Error::~Error);
  }
  psVar4 = (string *)__cxa_allocate_exception(0x28);
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"the variable is not declared","");
  iVar1 = this->_currentLine;
  *(string **)psVar4 = psVar4 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar4,local_90,local_90 + local_88);
  *(long *)(psVar4 + 0x20) = (long)iVar1;
  __cxa_throw(psVar4,&Error::typeinfo,Error::~Error);
}

Assistant:

void Analyser::analyse_scan_statement()
{
	auto next = nextToken();
	if (!next.has_value() || next.value().GetType() != TokenType::LEFT_BRACKET) {
		throw Error("Missing '('", _currentLine);
	}
	next = nextToken();
	if (!next.has_value() || next.value().GetType() != TokenType::IDENTIFIER) {
		throw Error("Missing identifier", _currentLine);
	}
	std::string var = std::any_cast<std::string>(next.value().GetValue());
	if (!loadVariable(var)) {
		throw Error("the variable is not declared", _currentLine);
	}
	addInstruction(Instruction(Operation::iscan));
	addInstruction(Instruction(Operation::istore));
	next = nextToken();
	if (!next.has_value() || next.value().GetType() != TokenType::RIGHT_BRACKET) {
		throw Error("Missing ')'", _currentLine);
	}
	next = nextToken();
	if (!next.has_value() || next.value().GetType() != TokenType::SEMICOLON) {
		throw Error("Missing ';'", _currentLine);
	}
}